

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging_cfg.c
# Opt level: O0

int oonf_logcfg_schema_validate(cfg_schema_entry *entry,char *section_name,char *value,autobuf *out)

{
  int iVar1;
  int local_34;
  int i;
  autobuf *out_local;
  char *value_local;
  char *section_name_local;
  cfg_schema_entry *entry_local;
  
  local_34 = 0;
  while( true ) {
    if (0x7f < local_34) {
      cfg_append_printable_line
                (out,"Unknown value \'%s\' for entry \'%s\' in section %s",value,(entry->key).entry,
                 section_name);
      return -1;
    }
    if ((LOG_SOURCE_NAMES[local_34] != (char *)0x0) &&
       (iVar1 = strcasecmp(value,LOG_SOURCE_NAMES[local_34]), iVar1 == 0)) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int
oonf_logcfg_schema_validate(
  const struct cfg_schema_entry *entry, const char *section_name, const char *value, struct autobuf *out) {
  int i;

  for (i = 0; i < LOG_MAXIMUM_SOURCES; i++) {
    if (LOG_SOURCE_NAMES[i] != 0 && strcasecmp(value, LOG_SOURCE_NAMES[i]) == 0) {
      return 0;
    }
  }

  cfg_append_printable_line(out,
    "Unknown value '%s'"
    " for entry '%s' in section %s",
    value, entry->key.entry, section_name);
  return -1;
}